

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode3OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  byte bVar3;
  ARM_AM_AddrOpc Op;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar5;
  char *pcVar6;
  uint ImmOffs;
  ARM_AM_AddrOpc subtracted;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  iVar5 = MCOperand_getImm(op_00);
  Op = getAM3Op((uint)iVar5);
  uVar4 = MCOperand_getReg(op);
  if (uVar4 == 0) {
    iVar5 = MCOperand_getImm(op_00);
    bVar3 = getAM3Offset((uint)iVar5);
    uVar4 = (uint)bVar3;
    if (uVar4 < 10) {
      pcVar6 = ARM_AM_getAddrOpcStr(Op);
      SStream_concat(O,"#%s%u",pcVar6,(ulong)uVar4);
    }
    else {
      pcVar6 = ARM_AM_getAddrOpcStr(Op);
      SStream_concat(O,"#%s0x%x",pcVar6,(ulong)uVar4);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      if (Op == ARM_AM_sub) {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = -uVar4;
      }
      else {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = '\x01';
      }
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  else {
    pcVar6 = ARM_AM_getAddrOpcStr(Op);
    SStream_concat0(O,pcVar6);
    h = MI->csh;
    uVar4 = MCOperand_getReg(op);
    printRegName(h,O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = Op == ARM_AM_sub;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  return;
}

Assistant:

static void printAddrMode3OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = getAM3Op((unsigned int)MCOperand_getImm(MO2));
	unsigned ImmOffs;

	if (MCOperand_getReg(MO1)) {
		SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
		printRegName(MI->csh, O, MCOperand_getReg(MO1));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			MI->flat_insn->detail->arm.op_count++;
		}
		return;
	}

	ImmOffs = getAM3Offset((unsigned int)MCOperand_getImm(MO2));
	if (ImmOffs > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	else
		SStream_concat(O, "#%s%u", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;

		if (subtracted) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = true;
		} else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = -(int)ImmOffs;

		MI->flat_insn->detail->arm.op_count++;
	}
}